

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback-queue.cc
# Opt level: O0

void __thiscall capture_thread::testing::CallbackQueue::WaitUntilEmpty(CallbackQueue *this)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  bool bVar2;
  
  std::unique_lock<std::mutex>::unique_lock
            (in_RDI,(mutex_type *)
                    CONCAT17(in_stack_ffffffffffffffcf,
                             CONCAT16(in_stack_ffffffffffffffce,
                                      CONCAT15(in_stack_ffffffffffffffcd,in_stack_ffffffffffffffc8))
                            ));
  while( true ) {
    bVar2 = false;
    if ((in_RDI[5].field_0xc & 1) == 0) {
      bVar1 = std::
              queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
              ::empty((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
                       *)0x1167dc);
      bVar2 = true;
      if (bVar1) {
        bVar2 = 0 < *(int *)&in_RDI[5]._M_owns;
      }
    }
    if (!bVar2) break;
    std::condition_variable::wait((unique_lock *)&in_RDI[2]._M_owns);
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void CallbackQueue::WaitUntilEmpty() {
  std::unique_lock<std::mutex> lock(queue_lock_);
  while (!terminated_ && (!queue_.empty() || pending_ > 0)) {
    condition_.wait(lock);
  }
}